

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O1

void duckdb::DecimalRoundNegativePrecisionFunction<long,duckdb::NumericHelper>
               (DataChunk *input,ExpressionState *state,Vector *result)

{
  ulong *puVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  UnifiedVectorFormat *pUVar5;
  long *plVar6;
  long *plVar7;
  long lVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  undefined8 uVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var10;
  byte bVar11;
  uint uVar12;
  BoundFunctionExpression *pBVar13;
  pointer pFVar14;
  const_reference pvVar15;
  pointer pEVar16;
  reference vector;
  long lVar17;
  UnifiedVectorFormat *pUVar18;
  TemplatedValidityData<unsigned_long> *pTVar19;
  long lVar20;
  long lVar21;
  ulong uVar22;
  VectorType VVar23;
  UnifiedVectorFormat *pUVar24;
  long lVar25;
  ulong uVar26;
  ulong uVar27;
  idx_t idx_in_entry;
  UnifiedVectorFormat *pUVar28;
  long lVar29;
  undefined8 local_a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_a0;
  long local_90;
  Vector *local_88;
  unsigned_long local_80;
  long *local_78;
  long local_70;
  long local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  pBVar13 = BaseExpression::Cast<duckdb::BoundFunctionExpression>(*(BaseExpression **)(state + 8));
  pFVar14 = unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::
            operator->((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
                        *)(pBVar13 + 0x198));
  pvVar15 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                          *)(pBVar13 + 0x180),0);
  pEVar16 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
            operator->(pvVar15);
  uVar12 = duckdb::DecimalType::GetScale((LogicalType *)(pEVar16 + 0x38));
  pvVar15 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                          *)(pBVar13 + 0x180),0);
  pEVar16 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
            operator->(pvVar15);
  bVar11 = duckdb::DecimalType::GetWidth((LogicalType *)(pEVar16 + 0x38));
  iVar2 = *(int *)(pFVar14 + 8);
  VVar23 = (VectorType)result;
  if ((int)((uVar12 & 0xff) - (uint)bVar11) < iVar2) {
    lVar3 = (&NumericHelper::POWERS_OF_TEN)[(int)((uVar12 & 0xff) - iVar2)];
    lVar4 = (&NumericHelper::POWERS_OF_TEN)[-(long)iVar2];
    lVar29 = lVar3 / 2;
    vector = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)input,0);
    pUVar5 = *(UnifiedVectorFormat **)(input + 0x18);
    if (*vector == (value_type)0x0) {
      duckdb::Vector::SetVectorType(VVar23);
      lVar20 = *(long *)(result + 0x20);
      lVar8 = *(long *)(vector + 0x20);
      FlatVector::VerifyFlatVector(vector);
      FlatVector::VerifyFlatVector(result);
      if (*(long *)(vector + 0x28) == 0) {
        if (pUVar5 != (UnifiedVectorFormat *)0x0) {
          pUVar28 = (UnifiedVectorFormat *)0x0;
          do {
            lVar25 = *(long *)(lVar8 + (long)pUVar28 * 8);
            lVar21 = lVar29;
            if (lVar25 < 0) {
              lVar21 = -lVar29;
            }
            *(long *)(lVar20 + (long)pUVar28 * 8) = ((lVar21 + lVar25) / lVar3) * lVar4;
            pUVar28 = pUVar28 + 1;
          } while (pUVar5 != pUVar28);
        }
      }
      else {
        *(long *)(result + 0x28) = *(long *)(vector + 0x28);
        shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                  ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)(result + 0x30)
                   ,(shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                    (vector + 0x30));
        *(undefined8 *)(result + 0x40) = *(undefined8 *)(vector + 0x40);
        if ((UnifiedVectorFormat *)0x3f < pUVar5 + 0x3f) {
          lVar25 = *(long *)(vector + 0x28);
          uVar26 = 0;
          pUVar28 = (UnifiedVectorFormat *)0x0;
          do {
            if (lVar25 == 0) {
              uVar27 = 0xffffffffffffffff;
            }
            else {
              uVar27 = *(ulong *)(lVar25 + uVar26 * 8);
            }
            pUVar18 = pUVar28 + 0x40;
            if (pUVar5 <= pUVar28 + 0x40) {
              pUVar18 = pUVar5;
            }
            pUVar24 = pUVar18;
            if (uVar27 != 0) {
              pUVar24 = pUVar28;
              if (uVar27 == 0xffffffffffffffff) {
                if (pUVar28 < pUVar18) {
                  do {
                    lVar21 = *(long *)(lVar8 + (long)pUVar28 * 8);
                    lVar17 = lVar29;
                    if (lVar21 < 0) {
                      lVar17 = -lVar29;
                    }
                    *(long *)(lVar20 + (long)pUVar28 * 8) = ((lVar17 + lVar21) / lVar3) * lVar4;
                    pUVar28 = pUVar28 + 1;
                    pUVar24 = pUVar28;
                  } while (pUVar18 != pUVar28);
                }
              }
              else if (pUVar28 < pUVar18) {
                uVar22 = 0;
                do {
                  if ((uVar27 >> (uVar22 & 0x3f) & 1) != 0) {
                    lVar21 = *(long *)(lVar8 + (long)pUVar28 * 8 + uVar22 * 8);
                    lVar17 = lVar29;
                    if (lVar21 < 0) {
                      lVar17 = -lVar29;
                    }
                    *(long *)(lVar20 + (long)pUVar28 * 8 + uVar22 * 8) =
                         ((lVar17 + lVar21) / lVar3) * lVar4;
                  }
                  uVar22 = uVar22 + 1;
                } while (pUVar28 + (uVar22 - (long)pUVar18) != (UnifiedVectorFormat *)0x0);
                pUVar24 = pUVar28 + uVar22;
              }
            }
            uVar26 = uVar26 + 1;
            pUVar28 = pUVar24;
          } while (uVar26 != (ulong)(pUVar5 + 0x3f) >> 6);
        }
      }
    }
    else if (*vector == (value_type)0x2) {
      duckdb::Vector::SetVectorType(VVar23);
      plVar6 = *(long **)(result + 0x20);
      plVar7 = *(long **)(vector + 0x20);
      if ((*(byte **)(vector + 0x28) != (byte *)0x0) && ((**(byte **)(vector + 0x28) & 1) == 0)) {
        duckdb::ConstantVector::SetNull(result,true);
        return;
      }
      duckdb::ConstantVector::SetNull(result,false);
      lVar20 = -lVar29;
      if (-1 < *plVar7) {
        lVar20 = lVar29;
      }
      *plVar6 = ((lVar20 + *plVar7) / lVar3) * lVar4;
    }
    else {
      duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_78);
      duckdb::Vector::ToUnifiedFormat((ulong)vector,pUVar5);
      duckdb::Vector::SetVectorType(VVar23);
      lVar20 = *(long *)(result + 0x20);
      FlatVector::VerifyFlatVector(result);
      if (local_68 == 0) {
        if (pUVar5 != (UnifiedVectorFormat *)0x0) {
          lVar8 = *local_78;
          pUVar28 = (UnifiedVectorFormat *)0x0;
          do {
            pUVar18 = pUVar28;
            if (lVar8 != 0) {
              pUVar18 = (UnifiedVectorFormat *)(ulong)*(uint *)(lVar8 + (long)pUVar28 * 4);
            }
            lVar25 = *(long *)(local_70 + (long)pUVar18 * 8);
            lVar21 = lVar29;
            if (lVar25 < 0) {
              lVar21 = -lVar29;
            }
            *(long *)(lVar20 + (long)pUVar28 * 8) = ((lVar21 + lVar25) / lVar3) * lVar4;
            pUVar28 = pUVar28 + 1;
          } while (pUVar5 != pUVar28);
        }
      }
      else if (pUVar5 != (UnifiedVectorFormat *)0x0) {
        lVar8 = *local_78;
        local_88 = result + 0x30;
        lVar25 = -lVar29;
        pUVar28 = (UnifiedVectorFormat *)0x0;
        local_90 = lVar25;
        do {
          pUVar18 = pUVar28;
          if (lVar8 != 0) {
            pUVar18 = (UnifiedVectorFormat *)(ulong)*(uint *)(lVar8 + (long)pUVar28 * 4);
          }
          if ((*(ulong *)(local_68 + ((ulong)pUVar18 >> 6) * 8) >> ((ulong)pUVar18 & 0x3f) & 1) == 0
             ) {
            if (*(long *)(result + 0x28) == 0) {
              local_80 = *(unsigned_long *)(result + 0x40);
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)&local_a8,&local_80);
              p_Var10 = p_Stack_a0;
              uVar9 = local_a8;
              local_a8 = 0;
              p_Stack_a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              this = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38);
              *(undefined8 *)(result + 0x30) = uVar9;
              *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38) = p_Var10;
              if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
              }
              if (p_Stack_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_a0);
              }
              pTVar19 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *
                                   )local_88);
              *(unsigned_long **)(result + 0x28) =
                   (pTVar19->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
              lVar25 = local_90;
            }
            bVar11 = (byte)pUVar28 & 0x3f;
            puVar1 = (ulong *)(*(long *)(result + 0x28) + ((ulong)pUVar28 >> 6) * 8);
            *puVar1 = *puVar1 & (-2L << bVar11 | 0xfffffffffffffffeU >> 0x40 - bVar11);
          }
          else {
            lVar21 = *(long *)(local_70 + (long)pUVar18 * 8);
            lVar17 = lVar29;
            if (lVar21 < 0) {
              lVar17 = lVar25;
            }
            *(long *)(lVar20 + (long)pUVar28 * 8) = ((lVar17 + lVar21) / lVar3) * lVar4;
          }
          pUVar28 = pUVar28 + 1;
        } while (pUVar5 != pUVar28);
      }
      if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
      }
      if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
      }
    }
  }
  else {
    duckdb::Vector::SetVectorType(VVar23);
    duckdb::Value::INTEGER((int)&local_78);
    duckdb::Vector::SetValue((ulong)result,(Value *)0x0);
    duckdb::Value::~Value((Value *)&local_78);
  }
  return;
}

Assistant:

static void DecimalRoundNegativePrecisionFunction(DataChunk &input, ExpressionState &state, Vector &result) {
	auto &func_expr = state.expr.Cast<BoundFunctionExpression>();
	auto &info = func_expr.bind_info->Cast<RoundPrecisionFunctionData>();
	auto source_scale = DecimalType::GetScale(func_expr.children[0]->return_type);
	auto width = DecimalType::GetWidth(func_expr.children[0]->return_type);
	if (info.target_scale <= -int32_t(width - source_scale)) {
		// scale too big for width
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
		result.SetValue(0, Value::INTEGER(0));
		return;
	}
	T divide_power_of_ten = UnsafeNumericCast<T>(POWERS_OF_TEN_CLASS::POWERS_OF_TEN[-info.target_scale + source_scale]);
	T multiply_power_of_ten = UnsafeNumericCast<T>(POWERS_OF_TEN_CLASS::POWERS_OF_TEN[-info.target_scale]);
	T addition = divide_power_of_ten / 2;

	UnaryExecutor::Execute<T, T>(input.data[0], result, input.size(), [&](T input) {
		if (input < 0) {
			input -= addition;
		} else {
			input += addition;
		}
		return UnsafeNumericCast<T>(input / divide_power_of_ten * multiply_power_of_ten);
	});
}